

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::visitSwitch
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermSwitch *node)

{
  Builder *this_00;
  bool bVar1;
  TIntermNode *pTVar2;
  int iVar3;
  Id selector;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  TType *type;
  undefined4 extraout_var_01;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined4 in_register_00000034;
  uint uVar8;
  undefined8 *puVar9;
  uint local_ac;
  vector<TIntermNode_*,_std::allocator<TIntermNode_*>_> codeSegments;
  vector<spv::Block_*,_std::allocator<spv::Block_*>_> segmentBlocks;
  vector<int,_std::allocator<int>_> caseValues;
  vector<int,_std::allocator<int>_> valueIndexToSegment;
  
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])
                    (node,CONCAT44(in_register_00000034,param_1));
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar3),this);
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1d])(node);
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
                             ((long *)CONCAT44(extraout_var_00,iVar3));
  type = (TType *)(**(code **)(*plVar4 + 0xf0))(plVar4);
  selector = accessChainLoad(this,type);
  bVar1 = node->flatten;
  uVar8 = (node->dontFlatten & 1) * 2;
  codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 400))
                    ((long *)CONCAT44(extraout_var_01,iVar3));
  caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&valueIndexToSegment,*(long *)(lVar5 + 0x10) - *(long *)(lVar5 + 8) >> 3,
             (allocator_type *)&segmentBlocks);
  uVar7 = 0xffffffffffffffff;
  for (puVar9 = *(undefined8 **)(lVar5 + 8); puVar9 != *(undefined8 **)(lVar5 + 0x10);
      puVar9 = puVar9 + 1) {
    segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*puVar9;
    lVar6 = (*(code *)(*segmentBlocks.
                        super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->parent)();
    if ((lVar6 == 0) ||
       (lVar6 = (*(code *)(*segmentBlocks.
                            super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                            super__Vector_impl_data._M_start)->parent)(),
       *(int *)(lVar6 + 0x20) != 0x16e)) {
      lVar6 = (*(code *)(*segmentBlocks.
                          super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->parent)();
      if ((lVar6 == 0) ||
         (lVar6 = (*(code *)(*segmentBlocks.
                              super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                              _M_impl.super__Vector_impl_data._M_start)->parent)(),
         *(int *)(lVar6 + 0x20) != 0x16d)) {
        std::vector<TIntermNode_*,_std::allocator<TIntermNode_*>_>::push_back
                  (&codeSegments,(value_type *)&segmentBlocks);
      }
      else {
        *(int *)((long)valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start +
                ((long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start)) =
             (int)((ulong)((long)codeSegments.
                                 super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)codeSegments.
                                super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar6 = (*(code *)(*segmentBlocks.
                            super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                            super__Vector_impl_data._M_start)->parent)();
        lVar6 = (**(code **)(**(long **)(lVar6 + 0x28) + 0x28))();
        local_ac = **(uint **)(*(long *)(lVar6 + 0xc0) + 8);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&caseValues,(int *)&local_ac);
      }
    }
    else {
      uVar7 = (ulong)((long)codeSegments.
                            super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)codeSegments.
                           super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3;
    }
  }
  if (bVar1 != false) {
    uVar8 = 1;
  }
  if ((long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish -
      (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start == 0) {
    iVar3 = (int)((ulong)((long)codeSegments.
                                super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)codeSegments.
                               super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
LAB_003457e3:
    if ((int)uVar7 != iVar3) goto LAB_0034580a;
  }
  else {
    iVar3 = (int)((ulong)((long)codeSegments.
                                super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)codeSegments.
                               super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (*(int *)((long)valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start +
                ((long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)caseValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) + -4) != iVar3) goto LAB_003457e3;
  }
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<TIntermNode*,std::allocator<TIntermNode*>>::emplace_back<TIntermNode*>
            ((vector<TIntermNode*,std::allocator<TIntermNode*>> *)&codeSegments,
             (TIntermNode **)&segmentBlocks);
  iVar3 = (int)((ulong)((long)codeSegments.
                              super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)codeSegments.
                             super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
LAB_0034580a:
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->builder;
  spv::Builder::makeSwitch
            (this_00,selector,uVar8,iVar3,&caseValues,&valueIndexToSegment,(int)uVar7,&segmentBlocks
            );
  local_ac = local_ac & 0xffffff00;
  std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
            (&(this->breakForLoop).c,(bool *)&local_ac);
  for (uVar8 = 0;
      (ulong)uVar8 <
      (ulong)((long)codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    spv::Builder::nextSwitchSegment(this_00,&segmentBlocks,uVar8);
    pTVar2 = codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8];
    if (pTVar2 == (TIntermNode *)0x0) {
      spv::Builder::addSwitchBreak(this_00,true);
    }
    else {
      (*pTVar2->_vptr_TIntermNode[2])(pTVar2,this);
    }
  }
  std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->breakForLoop).c);
  spv::Builder::endSwitch
            (this_00,(vector<spv::Block_*,_std::allocator<spv::Block_*>_> *)
                     &segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>)
  ;
  std::_Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>::~_Vector_base
            (&segmentBlocks.super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&valueIndexToSegment.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&caseValues.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>::~_Vector_base
            (&codeSegments.super__Vector_base<TIntermNode_*,_std::allocator<TIntermNode_*>_>);
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitSwitch(glslang::TVisit /* visit */, glslang::TIntermSwitch* node)
{
    // emit and get the condition before doing anything with switch
    node->getCondition()->traverse(this);
    spv::Id selector = accessChainLoad(node->getCondition()->getAsTyped()->getType());

    // Selection control:
    const spv::SelectionControlMask control = TranslateSwitchControl(*node);

    // browse the children to sort out code segments
    int defaultSegment = -1;
    std::vector<TIntermNode*> codeSegments;
    glslang::TIntermSequence& sequence = node->getBody()->getSequence();
    std::vector<int> caseValues;
    std::vector<int> valueIndexToSegment(sequence.size());  // note: probably not all are used, it is an overestimate
    for (glslang::TIntermSequence::iterator c = sequence.begin(); c != sequence.end(); ++c) {
        TIntermNode* child = *c;
        if (child->getAsBranchNode() && child->getAsBranchNode()->getFlowOp() == glslang::EOpDefault)
            defaultSegment = (int)codeSegments.size();
        else if (child->getAsBranchNode() && child->getAsBranchNode()->getFlowOp() == glslang::EOpCase) {
            valueIndexToSegment[caseValues.size()] = (int)codeSegments.size();
            caseValues.push_back(child->getAsBranchNode()->getExpression()->getAsConstantUnion()
                ->getConstArray()[0].getIConst());
        } else
            codeSegments.push_back(child);
    }

    // handle the case where the last code segment is missing, due to no code
    // statements between the last case and the end of the switch statement
    if ((caseValues.size() && (int)codeSegments.size() == valueIndexToSegment[caseValues.size() - 1]) ||
        (int)codeSegments.size() == defaultSegment)
        codeSegments.push_back(nullptr);

    // make the switch statement
    std::vector<spv::Block*> segmentBlocks; // returned, as the blocks allocated in the call
    builder.makeSwitch(selector, control, (int)codeSegments.size(), caseValues, valueIndexToSegment, defaultSegment,
        segmentBlocks);

    // emit all the code in the segments
    breakForLoop.push(false);
    for (unsigned int s = 0; s < codeSegments.size(); ++s) {
        builder.nextSwitchSegment(segmentBlocks, s);
        if (codeSegments[s])
            codeSegments[s]->traverse(this);
        else
            builder.addSwitchBreak(true);
    }
    breakForLoop.pop();

    builder.endSwitch(segmentBlocks);

    return false;
}